

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_NewClass(JSRuntime *rt,JSClassID class_id,JSClassDef *class_def)

{
  undefined4 uVar1;
  JSAtom JVar2;
  size_t sVar3;
  char *in_RDX;
  undefined4 in_ESI;
  JSAtom unaff_retaddr;
  JSClassDef *in_stack_00000008;
  JSAtom name;
  int len;
  int ret;
  int in_stack_ffffffffffffffc8;
  JSAtom in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  sVar3 = strlen(*(char **)in_RDX);
  uVar1 = (undefined4)sVar3;
  JVar2 = __JS_FindAtom((JSRuntime *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                        CONCAT44(in_stack_ffffffffffffffdc,uVar1),in_stack_ffffffffffffffd4);
  if ((JVar2 == 0) &&
     (JVar2 = __JS_NewAtomInit((JSRuntime *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),
                               (char *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                               in_stack_ffffffffffffffc8), JVar2 == 0)) {
    local_4 = -1;
  }
  else {
    local_4 = JS_NewClass1((JSRuntime *)class_def,ret,in_stack_00000008,unaff_retaddr);
    JS_FreeAtomRT((JSRuntime *)CONCAT44(JVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  }
  return local_4;
}

Assistant:

int JS_NewClass(JSRuntime *rt, JSClassID class_id, const JSClassDef *class_def)
{
    int ret, len;
    JSAtom name;

    len = strlen(class_def->class_name);
    name = __JS_FindAtom(rt, class_def->class_name, len, JS_ATOM_TYPE_STRING);
    if (name == JS_ATOM_NULL) {
        name = __JS_NewAtomInit(rt, class_def->class_name, len, JS_ATOM_TYPE_STRING);
        if (name == JS_ATOM_NULL)
            return -1;
    }
    ret = JS_NewClass1(rt, class_id, class_def, name);
    JS_FreeAtomRT(rt, name);
    return ret;
}